

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLGrammarPoolImpl.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::XMLGrammarPoolImpl::cacheGrammar(XMLGrammarPoolImpl *this,Grammar *gramToCache)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  void *key;
  
  bVar1 = false;
  if ((gramToCache != (Grammar *)0x0) && (bVar1 = false, this->fLocked == false)) {
    iVar2 = (*(gramToCache->super_XSerializable)._vptr_XSerializable[0x16])(gramToCache);
    key = (void *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x30))
                            ((long *)CONCAT44(extraout_var,iVar2));
    bVar1 = RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::containsKey
                      (this->fGrammarRegistry,key);
    if (!bVar1) {
      RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::put
                (this->fGrammarRegistry,key,gramToCache);
      if (this->fXSModelIsValid == true) {
        iVar2 = (*(gramToCache->super_XSerializable)._vptr_XSerializable[5])(gramToCache);
        if (iVar2 == 1) {
          this->fXSModelIsValid = false;
        }
      }
    }
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

bool XMLGrammarPoolImpl::cacheGrammar(Grammar* const               gramToCache )
{
    if(fLocked || !gramToCache)
        return false;

    const XMLCh* grammarKey = gramToCache->getGrammarDescription()->getGrammarKey();

    if (fGrammarRegistry->containsKey(grammarKey))
    {
        return false;
    }

    fGrammarRegistry->put((void*) grammarKey, gramToCache);

    if (fXSModelIsValid && gramToCache->getGrammarType() == Grammar::SchemaGrammarType)
    {
        fXSModelIsValid = false;
    }
    return true;
}